

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O1

void __thiscall wasm::OptimizeInstructions::visitArrayNew(OptimizeInstructions *this,ArrayNew *curr)

{
  Type *this_00;
  bool bVar1;
  bool bVar2;
  HeapType type_00;
  ArrayNewFixed *rep;
  Expression *pEVar3;
  Drop *this_01;
  Block *rep_00;
  ulong in_RCX;
  optional<wasm::Type> type_01;
  Type local_70;
  Type type;
  Literal zero;
  Builder local_38;
  Builder builder;
  
  if (((curr->super_SpecificExpression<(wasm::Expression::Id)70>).super_Expression.type.id != 1) &&
     (curr->init != (Expression *)0x0)) {
    this_00 = &(curr->super_SpecificExpression<(wasm::Expression::Id)70>).super_Expression.type;
    local_38.wasm =
         (this->
         super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
         ).
         super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
         .super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
         .currModule;
    pEVar3 = curr->size;
    if (pEVar3->_id == ConstId) {
      if (*(long *)(pEVar3 + 2) != 2) {
        __assert_fail("type == Type::i32",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                      ,0x120,"int32_t wasm::Literal::geti32() const");
      }
      if (*(int *)(pEVar3 + 1) == 1) {
        type_00 = wasm::Type::getHeapType(this_00);
        zero.type.id = (uintptr_t)curr->init;
        type.id = (uintptr_t)&zero.type;
        zero.field_0.i64 = 1;
        rep = Builder::makeArrayNewFixed<std::initializer_list<wasm::Expression*>>
                        (&local_38,type_00,(initializer_list<wasm::Expression_*> *)&type);
        replaceCurrent(this,(Expression *)rep);
        return;
      }
    }
    zero.type.id = (uintptr_t)wasm::Type::getHeapType(this_00);
    HeapType::getArray((HeapType *)&type);
    local_70.id = type.id;
    bVar1 = wasm::Type::isDefaultable(&local_70);
    if (bVar1) {
      Literal::makeZero((Literal *)&type,local_70);
      pEVar3 = getFallthrough(this,curr->init);
      bVar2 = Properties::isSingleConstantExpression(pEVar3);
      bVar1 = true;
      if (bVar2) {
        Properties::getLiteral((Literal *)&zero.type,pEVar3);
        bVar1 = Literal::operator!=((Literal *)&zero.type,(Literal *)&type);
        Literal::~Literal((Literal *)&zero.type);
      }
      if (bVar1 == false) {
        pEVar3 = curr->init;
        curr->init = (Expression *)0x0;
        this_01 = (Drop *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
        (this_01->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
        (this_01->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
        this_01->value = pEVar3;
        Drop::finalize(this_01);
        type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 0;
        type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)in_RCX;
        rep_00 = Builder::makeSequence(&local_38,(Expression *)this_01,(Expression *)curr,type_01);
        replaceCurrent(this,(Expression *)rep_00);
      }
      Literal::~Literal((Literal *)&type);
    }
  }
  return;
}

Assistant:

void visitArrayNew(ArrayNew* curr) {
    // If a value is provided, we can optimize in some cases.
    if (curr->type == Type::unreachable || curr->isWithDefault()) {
      return;
    }

    Builder builder(*getModule());

    // ArrayNew of size 1 is less efficient than ArrayNewFixed with one value
    // (the latter avoids a Const, which ends up saving one byte).
    // TODO: also look at the case with a fallthrough or effects on the size
    if (auto* c = curr->size->dynCast<Const>()) {
      if (c->value.geti32() == 1) {
        // Optimize to ArrayNewFixed. Note that if the value is the default
        // then we may end up optimizing further in visitArrayNewFixed.
        replaceCurrent(
          builder.makeArrayNewFixed(curr->type.getHeapType(), {curr->init}));
        return;
      }
    }

    // If the type is defaultable then perhaps the value here is the default.
    auto type = curr->type.getHeapType().getArray().element.type;
    if (!type.isDefaultable()) {
      return;
    }

    // The value must be the default/zero.
    auto zero = Literal::makeZero(type);
    auto* value = getFallthrough(curr->init);
    if (!Properties::isSingleConstantExpression(value) ||
        Properties::getLiteral(value) != zero) {
      return;
    }

    // Success! Drop the init and return an array.new_with_default.
    auto* init = curr->init;
    curr->init = nullptr;
    assert(curr->isWithDefault());
    replaceCurrent(builder.makeSequence(builder.makeDrop(init), curr));
  }